

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O1

char * SoapySDRDevice_getDriverKey(SoapySDRDevice *device)

{
  undefined1 *puVar1;
  char *__dest;
  undefined1 *local_40;
  size_t local_38;
  undefined1 local_30 [16];
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0014ce80);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  (**(code **)(*(long *)device + 0x10))(&local_40,device);
  __dest = callocArrayType<char>(local_38 + 1);
  if (local_38 != 0) {
    memmove(__dest,local_40,local_38);
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return __dest;
}

Assistant:

char *SoapySDRDevice_getDriverKey(const SoapySDRDevice *device)
{
    __SOAPY_SDR_C_TRY
    return toCString(device->getDriverKey());
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}